

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int jsonEachPathLength(JsonEachCursor *p)

{
  char cVar1;
  char *pcVar2;
  u32 i;
  u32 uVar3;
  ulong uVar4;
  uint uVar5;
  u32 sz;
  u32 local_44;
  JsonEachCursor *local_40;
  char *local_38;
  
  uVar5 = (uint)(p->path).nUsed;
  if ((p->iRowid == 0) && (1 < uVar5 && p->bRecursive != '\0')) {
    pcVar2 = (p->path).zBuf;
    local_38 = pcVar2 + 1;
    uVar4 = (ulong)(uVar5 - 1);
    local_40 = p;
    do {
      cVar1 = pcVar2[uVar4];
      if ((cVar1 == '[') || (cVar1 == '.')) {
        local_44 = 0;
        pcVar2[uVar4] = '\0';
        i = jsonLookupStep(&p->sParse,0,local_38,0);
        pcVar2[uVar4] = cVar1;
        if ((i < 0xfffffffd) &&
           (uVar3 = jsonbPayloadSize(&p->sParse,i,&local_44), uVar3 + i == local_40->i)) {
          return (int)uVar4;
        }
      }
      uVar4 = uVar4 - 1;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
    uVar5 = 1;
  }
  return uVar5;
}

Assistant:

static int jsonEachPathLength(JsonEachCursor *p){
  u32 n = p->path.nUsed;
  char *z = p->path.zBuf;
  if( p->iRowid==0 && p->bRecursive && n>=2 ){
    while( n>1 ){
      n--;
      if( z[n]=='[' || z[n]=='.' ){
        u32 x, sz = 0;
        char cSaved = z[n];
        z[n] = 0;
        assert( p->sParse.eEdit==0 );
        x = jsonLookupStep(&p->sParse, 0, z+1, 0);
        z[n] = cSaved;
        if( JSON_LOOKUP_ISERROR(x) ) continue;
        if( x + jsonbPayloadSize(&p->sParse, x, &sz) == p->i ) break;
      }
    }
  }
  return n;
}